

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O1

void __thiscall
TPZFBMatrix<std::complex<float>_>::MultAdd
          (TPZFBMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar2;
  int64_t i;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined8 uVar7;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float in_XMM0_Dc;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float in_XMM0_Dd;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar8;
  float fVar9;
  undefined8 local_b0;
  TPZFMatrix<std::complex<float>_> *local_a8;
  long local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar4 = (int)alpha._M_value;
  iVar1 = iVar4;
  local_a8 = z;
  local_98 = in_XMM0_Da;
  fStack_94 = in_XMM0_Db;
  fStack_90 = in_XMM0_Dc;
  fStack_8c = in_XMM0_Dd;
  local_88._0_4_ = (float)in_XMM1_Da;
  local_88._4_4_ = (float)in_XMM1_Db;
  fStack_80 = in_XMM1_Dc;
  fStack_7c = in_XMM1_Dd;
  if (((iVar4 == 0) &&
      ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
       (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow !=
      (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZFBMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ,"TPZFBMatrix::MultAdd <matrixs with incompatible dimensions>");
  }
  if (((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
       (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZFBMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ,"TPZFBMatrix::MultAdd incompatible dimensions\n");
  }
  local_48 = fStack_94;
  fStack_44 = local_98;
  fStack_40 = fStack_90;
  fStack_3c = fStack_8c;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,local_a8,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar1);
  local_a0 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  local_60 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if (iVar4 == 0) {
    if (0 < local_60) {
      local_58 = fStack_94;
      fStack_54 = fStack_94;
      fStack_50 = fStack_94;
      fStack_4c = fStack_94;
      lVar6 = 0;
      do {
        if (0 < local_a0) {
          lVar5 = 0;
          do {
            lVar3 = lVar5 - this->fBandLower;
            if (lVar3 < 1) {
              lVar3 = 0;
            }
            lVar2 = this->fBandUpper;
            iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                      super_TPZSavable._vptr_TPZSavable[0xc])(this);
            if (lVar5 + lVar2 + 1 < CONCAT44(extraout_var_01,iVar1)) {
              lVar2 = lVar5 + this->fBandUpper + 1;
            }
            else {
              iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                        super_TPZSavable._vptr_TPZSavable[0xc])(this);
              lVar2 = CONCAT44(extraout_var_02,iVar1);
            }
            (*(local_a8->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable
              ._vptr_TPZSavable[0x24])(local_a8,lVar5,lVar6);
            local_b0 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
            for (; lVar3 < lVar2; lVar3 = lVar3 + 1) {
              (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(this,lVar5,lVar3);
              local_88._4_4_ = extraout_XMM0_Db_03 * fStack_94;
              fStack_80 = extraout_XMM0_Dc_01 * fStack_90;
              fStack_7c = extraout_XMM0_Dd_01 * fStack_8c;
              fStack_74 = fStack_44 * extraout_XMM0_Db_03;
              local_88._0_4_ = extraout_XMM0_Da_03 * local_98 - local_88._4_4_;
              local_78 = fStack_74 + local_48 * extraout_XMM0_Da_03;
              fStack_6c = fStack_74;
              local_88 = CONCAT44(local_88._4_4_,(float)local_88);
              if ((NAN((float)local_88)) &&
                 (local_88 = CONCAT44(local_88._4_4_,(float)local_88), NAN(local_78))) {
                fStack_70 = fStack_74;
                local_88 = __mulsc3(local_98,local_58,extraout_XMM0_Da_03,extraout_XMM0_Db_03);
                local_78 = (float)((ulong)local_88 >> 0x20);
                fStack_80 = extraout_XMM0_Dc_02;
                fStack_7c = extraout_XMM0_Dd_02;
                fStack_6c = local_78;
              }
              fStack_74 = fStack_6c;
              fStack_70 = fStack_6c;
              (*(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(x,lVar3,lVar6);
              fVar8 = (float)local_88 * extraout_XMM0_Da_04 - extraout_XMM0_Db_04 * local_78;
              fVar9 = extraout_XMM0_Da_04 * local_78 + (float)local_88 * extraout_XMM0_Db_04;
              uVar7 = CONCAT44(fVar9,fVar8);
              if ((NAN(fVar8)) && (uVar7 = CONCAT44(fVar9,fVar8), NAN(fVar9))) {
                uVar7 = __mulsc3((float)local_88,local_78,extraout_XMM0_Da_04,extraout_XMM0_Db_04);
              }
              local_b0 = CONCAT44((float)((ulong)local_b0 >> 0x20) + (float)((ulong)uVar7 >> 0x20),
                                  (float)local_b0 + (float)uVar7);
            }
            (*(local_a8->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable
              ._vptr_TPZSavable[0x23])(local_a8,lVar5,lVar6,&local_b0);
            lVar5 = lVar5 + 1;
          } while (lVar5 != local_a0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != local_60);
    }
  }
  else if (0 < local_60) {
    local_58 = fStack_94;
    fStack_54 = fStack_94;
    fStack_50 = fStack_94;
    fStack_4c = fStack_94;
    lVar6 = 0;
    do {
      if (0 < local_a0) {
        lVar5 = 0;
        do {
          lVar3 = lVar5 - this->fBandLower;
          if (lVar3 < 1) {
            lVar3 = 0;
          }
          lVar2 = this->fBandUpper;
          iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable[0xc])(this);
          if (lVar5 + lVar2 + 1 < CONCAT44(extraout_var,iVar1)) {
            lVar2 = lVar5 + this->fBandUpper + 1;
          }
          else {
            iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                      super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar2 = CONCAT44(extraout_var_00,iVar1);
          }
          (*(local_a8->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(local_a8,lVar5,lVar6);
          local_b0 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          for (; lVar3 < lVar2; lVar3 = lVar3 + 1) {
            (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(this,lVar3,lVar5);
            local_88._4_4_ = extraout_XMM0_Db_00 * fStack_94;
            fStack_80 = extraout_XMM0_Dc * fStack_90;
            fStack_7c = extraout_XMM0_Dd * fStack_8c;
            fStack_74 = fStack_44 * extraout_XMM0_Db_00;
            local_88._0_4_ = extraout_XMM0_Da_00 * local_98 - local_88._4_4_;
            local_78 = fStack_74 + local_48 * extraout_XMM0_Da_00;
            fStack_6c = fStack_74;
            local_88 = CONCAT44(local_88._4_4_,(float)local_88);
            if ((NAN((float)local_88)) &&
               (local_88 = CONCAT44(local_88._4_4_,(float)local_88), NAN(local_78))) {
              fStack_70 = fStack_74;
              local_88 = __mulsc3(local_98,local_58,extraout_XMM0_Da_00,extraout_XMM0_Db_00);
              local_78 = (float)((ulong)local_88 >> 0x20);
              fStack_80 = extraout_XMM0_Dc_00;
              fStack_7c = extraout_XMM0_Dd_00;
              fStack_6c = local_78;
            }
            fStack_74 = fStack_6c;
            fStack_70 = fStack_6c;
            (*(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(x,lVar3,lVar6);
            fVar8 = (float)local_88 * extraout_XMM0_Da_01 - extraout_XMM0_Db_01 * local_78;
            fVar9 = extraout_XMM0_Da_01 * local_78 + (float)local_88 * extraout_XMM0_Db_01;
            uVar7 = CONCAT44(fVar9,fVar8);
            if ((NAN(fVar8)) && (uVar7 = CONCAT44(fVar9,fVar8), NAN(fVar9))) {
              uVar7 = __mulsc3((float)local_88,local_78,extraout_XMM0_Da_01,extraout_XMM0_Db_01);
            }
            local_b0 = CONCAT44((float)((ulong)local_b0 >> 0x20) + (float)((ulong)uVar7 >> 0x20),
                                (float)local_b0 + (float)uVar7);
          }
          (*(local_a8->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_a8,lVar5,lVar6,&local_b0);
          lVar5 = lVar5 + 1;
        } while (lVar5 != local_a0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_60);
  }
  return;
}

Assistant:

void TPZFBMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
						  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error(__PRETTY_FUNCTION__, "TPZFBMatrix::MultAdd <matrixs with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		this->Error(__PRETTY_FUNCTION__,"TPZFBMatrix::MultAdd incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);
	int64_t rows = this->Rows();
	int64_t xcols = x.Cols();
	int64_t ic, r;
	if(opt == 0) {
		for (ic = 0; ic < xcols; ic++) {
			int64_t begin, end;
			for ( r = 0; r < rows; r++ ) {
				begin = MAX( r - fBandLower, 0 );
				end   = MIN( r + fBandUpper + 1, Dim() );
				TVar val = z.GetVal(r,ic);
				// Calcula um elemento da resposta.
				for ( int64_t i = begin ; i < end; i++ ) val += alpha * GetVal( r, i ) * x.GetVal( i, ic );
				z.PutVal( r, ic, val );
			}
		}
	} else {
		for (ic = 0; ic < xcols; ic++) {
			int64_t begin, end;
			for ( r = 0; r < rows; r++ ) {
				begin = MAX( r - fBandLower, 0 );
				end   = MIN( r + fBandUpper + 1, Dim() );
				TVar val = z.GetVal(r,ic);
				// Calcula um elemento da resposta.
				for ( int64_t i = begin ; i < end; i++ ) val += alpha * GetVal( i, r ) * x.GetVal( i, ic );
				z.PutVal( r, ic, val );
			}
		}
	}
}